

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O3

void __thiscall soul::heart::Parser::parseLatency(Parser *this)

{
  SourceCodeText *o;
  Module *pMVar1;
  ulong uVar2;
  CodeLocation errorPos;
  CodeLocation local_b8;
  PackedData local_a8;
  Value local_90;
  CompileMessage local_50;
  
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
  expect<soul::TokenType>
            (&this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ,(TokenType)0x27f6e0);
  Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>::
  expect<char_const*>((Tokeniser<soul::DummyKeywordMatcher,soul::HEARTOperator::Matcher,soul::IdentifierMatcher>
                       *)this,"latency");
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
  expect<soul::TokenType>
            (&this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ,(TokenType)0x259fb3);
  o = (this->
      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
      ).location.sourceCode.object;
  if (o != (SourceCodeText *)0x0) {
    (o->super_RefCountedObject).refCount = (o->super_RefCountedObject).refCount + 1;
  }
  local_b8.location.data =
       (this->
       super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
       ).location.location.data;
  local_b8.sourceCode.object = o;
  parseInt32Value(&local_90,this);
  soul::Value::getData(&local_a8,&local_90);
  uVar2 = soul::Value::PackedData::getAsInt64(&local_a8);
  soul::Value::~Value(&local_90);
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
  expect<soul::TokenType>
            (&this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ,(TokenType)0x2585e7);
  if (uVar2 < 0xea601) {
    pMVar1 = (this->module).object;
    if (pMVar1 != (Module *)0x0) {
      pMVar1->latency = (uint32_t)uVar2;
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(o);
      return;
    }
    throwInternalCompilerError("object != nullptr","operator->",0x3c);
  }
  CompileMessageHelpers::createMessage<>
            (&local_50,syntax,error,"This latency value is out of range");
  CodeLocation::throwError(&local_b8,&local_50);
}

Assistant:

void parseLatency()
    {
        expect (HEARTOperator::dot);
        expect ("latency");
        expect (HEARTOperator::assign);
        auto errorPos = location;
        auto latency = parseInt32Value().getAsInt64();
        expectSemicolon();

        if (latency < 0 || latency > AST::maxInternalLatency)
            errorPos.throwError (Errors::latencyOutOfRange());

        module->latency = static_cast<uint32_t> (latency);
    }